

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::write
          (BlockedRead *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  SourceLocation location;
  Promise<void> PVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  BlockedRead *this_00;
  ArrayPtr<const_unsigned_char> *unaff_R12;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:990:35)>
  *location_00;
  undefined8 uVar6;
  bool bVar7;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData;
  Promise<void> promise;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_2
  aStack_68;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_47;
  undefined1 local_30 [16];
  
  this_00 = (BlockedRead *)CONCAT44(in_register_00000034,__fd);
  bVar7 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  __kjCondition = (ArrayPtr<const_unsigned_char> *)CONCAT71(uStack_47,bVar7);
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c3,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  moreData.ptr = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
  moreData.size_ = __n - 1;
  uVar6 = &f;
  writeImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             *)uVar6,this_00,*__buf,moreData);
  if ((int)f.exception == 2) {
    uVar6 = aStack_68._24_8_;
    uVar3 = 1;
  }
  else {
    uVar5 = (int)f.exception - 1;
    aStack_68._8_8_ = ZEXT48(uVar5);
    aStack_68._0_8_ = extraout_RDX;
    aStack_68._16_8_ = unaff_R12;
    uVar3 = 0;
    if (1 < uVar5) {
      uVar3 = uVar5;
    }
  }
  if (uVar3 == 1) {
    if (aStack_68._8_8_ != 0) {
      AsyncPipe::write((AsyncPipe *)&promise,(int)this_00->pipe,(void *)aStack_68._0_8_,
                       aStack_68._8_8_);
      PVar2 = promise;
      if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)uVar6 ==
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *)0x0) {
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)promise.super_PromiseBase.node.ptr;
        promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      }
      else {
        continuationTracePtr =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:990:35)>
             ::anon_class_24_2_b6e2a7c2_for_func::operator();
        lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        __kjCondition = (ArrayPtr<const_unsigned_char> *)aStack_68._16_8_;
        if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x38) {
          pvVar4 = operator_new(0x400);
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:990:35)>
                         *)((long)pvVar4 + 0x3c8);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     (anon_class_24_2_b6e2a7c2_for_func *)&_kjCondition,&continuationTracePtr);
          *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:990:35)>
                         *)((long)promise.super_PromiseBase.node.ptr + -0x38);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
                     (anon_class_24_2_b6e2a7c2_for_func *)&_kjCondition,&continuationTracePtr);
          *(long *)((long)PVar2.super_PromiseBase.node.ptr + -0x30) = lVar1;
        }
        f.exception = (Exception *)&DAT_0042a172;
        location.function = &DAT_0042a1d1;
        location.fileName = &DAT_0042a172;
        location.lineNumber = 0x58b;
        location.columnNumber = 0x4c;
        intermediate.ptr = (PromiseNode *)location_00;
        kj::_::maybeChain<void>((OwnPromiseNode *)local_30,(Promise<void> *)&intermediate,location);
        uVar6 = local_30._0_8_;
        local_30._0_8_ = (Disposer *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_30);
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)uVar6;
        local_30._8_8_ = (ForkHub<kj::_::Void> *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_30 + 8));
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
      }
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
      return (ssize_t)this;
    }
    if ((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)uVar6 !=
        (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
         *)0x0) {
      AsyncPipe::write((AsyncPipe *)this,(int)this_00->pipe,(void *)aStack_68._16_8_,uVar6);
      return (ssize_t)this;
    }
  }
  else if (uVar3 != 0) {
    kj::_::unreachable();
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (ssize_t)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}